

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall r_comp::Compiler::compile(Compiler *this,Ptr *root,bool trace)

{
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Ptr node;
  Ptr view;
  allocator local_a1;
  Compiler *local_a0;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_98;
  Ptr *local_88;
  string local_80;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->err = false;
  this->trace = trace;
  this->current_object_index =
       (long)(this->_image->object_map).objects.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->_image->object_map).objects.m_vector.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start >> 2;
  peVar3 = (root->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var4 = &((peVar3->args).
             super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  local_a0 = this;
  local_88 = root;
  do {
    p_Var1 = &((peVar3->args).
               super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
    if (p_Var4 == p_Var1) {
LAB_00131718:
      return (bool)((local_a0->err ^ 1U) & p_Var4 == p_Var1);
    }
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,p_Var4);
    if ((local_98._M_ptr)->type != Directive) {
      p_Var5 = p_Var4 + 1;
      if (p_Var5 == &((((root->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->args).
                      super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                     super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>) {
        std::__cxx11::string::string((string *)&local_80,"missing view",&local_a1);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40,&local_98);
        set_error(local_a0,&local_80,(Ptr *)&local_40);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)&local_80,p_Var5
                  );
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_50,&local_98);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,
                   (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)&local_80);
        bVar2 = read_sys_object(local_a0,(Ptr *)&local_50,(Ptr *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        if (bVar2) {
          local_a0->current_object_index = local_a0->current_object_index + 1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
          root = local_88;
          goto LAB_001316a5;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_string_length);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
      goto LAB_00131718;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    p_Var5 = p_Var4;
LAB_001316a5:
    p_Var4 = p_Var5 + 1;
    peVar3 = (root->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  } while( true );
}

Assistant:

bool Compiler::compile(RepliStruct::Ptr root, bool trace)
{
    this->err = false;
    this->trace = trace;
    current_object_index = _image->object_map.objects.size();

    for (std::vector<RepliStruct::Ptr >::iterator iter = root->args.begin(); iter != root->args.end(); iter++) {
        RepliStruct::Ptr node = *iter;

        if (node->type == RepliStruct::Directive) {
            continue;
        }

        iter++;

        if (iter == root->args.end()) {
            set_error("missing view", node);
            return false;
        }

        RepliStruct::Ptr view = *iter;

        if (!read_sys_object(node, view)) {
            return false;
        }

        current_object_index++;
    }

    return !err;
}